

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

int Aig_ObjRecognizeExor(Aig_Obj_t *pObj,Aig_Obj_t **ppFan0,Aig_Obj_t **ppFan1)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  ulong uVar3;
  Aig_Obj_t **ppAVar4;
  ulong uVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x15a,"int Aig_ObjRecognizeExor(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
  }
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar2 & 7) - 7 < 0xfffffffe) {
    return 0;
  }
  uVar2 = uVar2 & 7;
  if (uVar2 == 5) {
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      return 0;
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      return 0;
    }
    uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if ((*(uint *)(uVar3 + 0x18) & 7) != 5) {
      return 0;
    }
    uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if ((*(uint *)(uVar5 + 0x18) & 7) != 5) {
      return 0;
    }
    pAVar1 = *(Aig_Obj_t **)(uVar3 + 8);
    if (1 < (*(ulong *)(uVar5 + 8) ^ (ulong)pAVar1)) {
      return 0;
    }
    if (1 < (*(ulong *)(uVar5 + 0x10) ^ *(ulong *)(uVar3 + 0x10))) {
      return 0;
    }
    if ((((uint)*(ulong *)(uVar5 + 8) ^ (uint)pAVar1) & 1) == 0) {
      return 0;
    }
    if ((((uint)*(ulong *)(uVar5 + 0x10) ^ (uint)*(ulong *)(uVar3 + 0x10)) & 1) == 0) {
      return 0;
    }
    ppAVar4 = (Aig_Obj_t **)(uVar3 + 0x10);
    *ppFan0 = pAVar1;
  }
  else {
    if (uVar2 != 6) {
      __assert_fail("Aig_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x163,"int Aig_ObjRecognizeExor(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
    }
    *ppFan0 = pObj->pFanin0;
    ppAVar4 = &pObj->pFanin1;
  }
  *ppFan1 = *ppAVar4;
  return 1;
}

Assistant:

int Aig_ObjRecognizeExor( Aig_Obj_t * pObj, Aig_Obj_t ** ppFan0, Aig_Obj_t ** ppFan1 )
{
    Aig_Obj_t * p0, * p1;
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) )
        return 0;
    if ( Aig_ObjIsExor(pObj) )
    {
        *ppFan0 = Aig_ObjChild0(pObj);
        *ppFan1 = Aig_ObjChild1(pObj);
        return 1;
    }
    assert( Aig_ObjIsAnd(pObj) );
    p0 = Aig_ObjChild0(pObj);
    p1 = Aig_ObjChild1(pObj);
    if ( !Aig_IsComplement(p0) || !Aig_IsComplement(p1) )
        return 0;
    p0 = Aig_Regular(p0);
    p1 = Aig_Regular(p1);
    if ( !Aig_ObjIsAnd(p0) || !Aig_ObjIsAnd(p1) )
        return 0;
    if ( Aig_ObjFanin0(p0) != Aig_ObjFanin0(p1) || Aig_ObjFanin1(p0) != Aig_ObjFanin1(p1) )
        return 0;
    if ( Aig_ObjFaninC0(p0) == Aig_ObjFaninC0(p1) || Aig_ObjFaninC1(p0) == Aig_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Aig_ObjChild0(p0);
    *ppFan1 = Aig_ObjChild1(p0);
    return 1;
}